

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O1

void __thiscall
cmOrderDirectoriesConstraint::FindImplicitConflicts
          (cmOrderDirectoriesConstraint *this,ostringstream *w)

{
  string *path;
  size_t __n;
  char cVar1;
  int iVar2;
  pointer pbVar3;
  ostream *poVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  string local_70;
  string local_50;
  
  pbVar3 = (this->OD->OriginalDirectories).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->OD->OriginalDirectories).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar3) {
    bVar5 = true;
    uVar6 = 0;
    uVar7 = 1;
    do {
      path = pbVar3 + uVar6;
      __n = pbVar3[uVar6]._M_string_length;
      bVar8 = true;
      if (__n == (this->Directory)._M_string_length) {
        if (__n == 0) {
          bVar8 = false;
        }
        else {
          iVar2 = bcmp((path->_M_dataplus)._M_p,(this->Directory)._M_dataplus._M_p,__n);
          bVar8 = iVar2 != 0;
        }
      }
      if (bVar8) {
        cmsys::SystemTools::GetRealPath(&local_50,path,(string *)0x0);
        cmsys::SystemTools::GetRealPath(&local_70,&this->Directory,(string *)0x0);
        if (local_50._M_string_length == local_70._M_string_length) {
          if (local_50._M_string_length != 0) {
            iVar2 = bcmp(local_50._M_dataplus._M_p,local_70._M_dataplus._M_p,
                         local_50._M_string_length);
            if (iVar2 != 0) goto LAB_00427e33;
          }
          goto LAB_00427e43;
        }
LAB_00427e33:
        iVar2 = (*this->_vptr_cmOrderDirectoriesConstraint[3])(this,path);
        cVar1 = (char)iVar2;
      }
      else {
LAB_00427e43:
        cVar1 = '\0';
      }
      if (bVar8) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if (cVar1 != '\0') {
        if (bVar5) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)w,"  ",2);
          (*this->_vptr_cmOrderDirectoriesConstraint[2])(this,w);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)w," in ",4);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)w,(this->Directory)._M_dataplus._M_p,
                              (this->Directory)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," may be hidden by files in:\n",0x1c);
          bVar5 = false;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)w,"    ",4);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)w,(path->_M_dataplus)._M_p,path->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      }
      pbVar3 = (this->OD->OriginalDirectories).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar8 = uVar7 < (ulong)((long)(this->OD->OriginalDirectories).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5);
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar8);
  }
  return;
}

Assistant:

void FindImplicitConflicts(std::ostringstream& w)
  {
    bool first = true;
    for (unsigned int i = 0; i < this->OD->OriginalDirectories.size(); ++i) {
      // Check if this directory conflicts with the entry.
      std::string const& dir = this->OD->OriginalDirectories[i];
      if (dir != this->Directory &&
          cmSystemTools::GetRealPath(dir) !=
            cmSystemTools::GetRealPath(this->Directory) &&
          this->FindConflict(dir)) {
        // The library will be found in this directory but it is
        // supposed to be found in an implicit search directory.
        if (first) {
          first = false;
          w << "  ";
          this->Report(w);
          w << " in " << this->Directory << " may be hidden by files in:\n";
        }
        w << "    " << dir << "\n";
      }
    }
  }